

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assembly_generator_x86.cpp
# Opt level: O2

void __thiscall
randomx::AssemblyGeneratorX86::genAddressRegDst
          (AssemblyGeneratorX86 *this,Instruction *instr,int maskAlign)

{
  ostream *poVar1;
  uint uVar2;
  uint uVar3;
  
  poVar1 = std::operator<<((ostream *)&this->field_0x10,"\tlea eax, [");
  poVar1 = std::operator<<(poVar1,*(char **)(regR32 + (ulong)instr->dst * 8));
  *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) =
       *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) | 0x800;
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,instr->imm32);
  *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) =
       *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) & 0xfffff7ff;
  poVar1 = std::operator<<(poVar1,"]");
  std::endl<char,std::char_traits<char>>(poVar1);
  uVar2 = 0x3ff8;
  if ((instr->mod & 3) == 0) {
    uVar2 = 0x3fff8;
  }
  uVar3 = 0x1ffff8;
  if (instr->mod < 0xe0) {
    uVar3 = uVar2;
  }
  poVar1 = std::operator<<((ostream *)&this->field_0x10,"\tand eax");
  poVar1 = std::operator<<(poVar1,", ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,-maskAlign & uVar3);
  std::endl<char,std::char_traits<char>>(poVar1);
  return;
}

Assistant:

void AssemblyGeneratorX86::genAddressRegDst(Instruction& instr, int maskAlign = 8) {
		asmCode << "\tlea eax, [" << regR32[instr.dst] << std::showpos << (int32_t)instr.getImm32() << std::noshowpos << "]" << std::endl;
		int mask;
		if (instr.getModCond() < StoreL3Condition) {
			mask = instr.getModMem() ? ScratchpadL1Mask : ScratchpadL2Mask;
		}
		else {
			mask = ScratchpadL3Mask;
		}
		asmCode << "\tand eax" << ", " << (mask & (-maskAlign)) << std::endl;
	}